

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O0

void __thiscall tinyusdz::MetaVariable::MetaVariable<int>(MetaVariable *this,int *v)

{
  void *local_20;
  int *local_18;
  int *v_local;
  MetaVariable *this_local;
  
  local_20 = (void *)0x0;
  local_18 = v;
  v_local = (int *)this;
  tinyusdz::value::Value::Value<decltype(nullptr)>(&this->_value,&local_20);
  std::__cxx11::string::string((string *)&this->_name);
  set_value<int>(this,local_18);
  return;
}

Assistant:

MetaVariable(const T &v) {
    set_value(v);
  }